

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicSemaphoreTests.cpp
# Opt level: O2

TestStatus *
vkt::synchronization::anon_unknown_0::basicMultiQueueCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  RefBase<vk::VkCommandBuffer_s_*> *this;
  RefBase<vk::Handle<(vk::HandleType)6>_> *this_00;
  ulong uVar1;
  VkResult VVar2;
  int iVar3;
  DeviceInterface *vk;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  NotSupportedError *this_01;
  deUint32 queueNdx;
  deUint32 dVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  float **ppfVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  VkSubmitInfo *pVVar12;
  VkSubmitInfo *pVVar13;
  undefined8 *puVar14;
  ulong uVar15;
  deUint32 queueReqNdx;
  long lVar16;
  Queues *pQVar17;
  byte bVar18;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_438;
  RefBase<vk::VkDevice_s_*> local_418;
  VkSubmitInfo swapInfo;
  Queues queues [2];
  VkPipelineStageFlags stageBits [1];
  Move<vk::Handle<(vk::HandleType)6>_> fence [2];
  float queuePriorities [2];
  Move<vk::VkCommandBuffer_s_*> cmdBuffer [2];
  Move<vk::Handle<(vk::HandleType)4>_> semaphore;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  undefined4 local_268 [2];
  undefined8 local_260;
  undefined4 local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined4 local_240;
  RefBase<vk::VkCommandBuffer_s_*> *local_238;
  undefined4 local_230;
  RefBase<vk::Handle<(vk::HandleType)4>_> *local_228;
  undefined4 local_220 [2];
  undefined8 local_218;
  undefined4 local_210;
  RefBase<vk::Handle<(vk::HandleType)4>_> *local_208;
  VkPipelineStageFlags *local_200;
  undefined4 local_1f8;
  RefBase<vk::VkCommandBuffer_s_*> *local_1f0;
  undefined4 local_1e8;
  undefined8 local_1e0;
  VkCommandBufferBeginInfo info;
  VkDeviceCreateInfo deviceInfo;
  VkDeviceQueueCreateInfo queueInfos [2];
  VkPhysicalDeviceFeatures deviceFeatures;
  
  bVar18 = 0;
  vk = Context::getDeviceInterface(context);
  vk_00 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  local_418.m_data.object = (VkDevice)0x0;
  local_418.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_418.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  queueFamilyProperties.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  queueFamilyProperties.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  queueFamilyProperties.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queuePriorities = (float  [2])&DAT_3f8000003f800000;
  queues[1].queue = (VkQueue)0x0;
  queues[1].queueFamilyIndex = 0xffffffff;
  queues[1]._12_4_ = 0;
  queues[0].queue = (VkQueue)0x0;
  queues[0].queueFamilyIndex = 0xffffffff;
  queues[0]._12_4_ = 0;
  info.flags = 4;
  info._20_4_ = 0;
  info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  info._4_4_ = 0;
  info.pNext = (void *)0x0;
  semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device = (VkDevice)0x0;
  semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
  semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
  cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
  cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  stageBits[0] = 1;
  fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0;
  fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0;
  fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &swapInfo,vk_00,physicalDevice);
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
  _M_move_assign(&queueFamilyProperties,&swapInfo);
  std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
  ~_Vector_base((_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                 *)&swapInfo);
  uVar8 = queues[0]._8_8_ & 0xffffffff;
  uVar1 = 0;
  uVar15 = queues[0]._8_8_ & 0xffffffff;
  while( true ) {
    uVar6 = uVar1;
    iVar3 = (int)uVar8;
    dVar4 = (deUint32)uVar6;
    if ((ulong)(((long)queueFamilyProperties.
                       super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)queueFamilyProperties.
                      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar6) break;
    if ((deUint32)uVar15 != 0xffffffff) {
      if (dVar4 == (deUint32)uVar15) goto LAB_0073311e;
LAB_00733130:
      queues[1].queueFamilyIndex = dVar4;
      goto LAB_00733140;
    }
    queues[0].queueFamilyIndex = dVar4;
    uVar8 = uVar6;
LAB_0073311e:
    iVar3 = (int)uVar8;
    if (1 < queueFamilyProperties.
            super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar6].queueCount) goto LAB_00733130;
    uVar1 = (ulong)(dVar4 + 1);
    uVar15 = uVar6;
  }
  uVar6 = queues[1]._8_8_ & 0xffffffff;
LAB_00733140:
  if ((iVar3 == -1) || (iVar5 = (int)uVar6, iVar5 == -1)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Queues couldn\'t be created",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
               ,0x9b);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ppfVar9 = &queueInfos[0].pQueuePriorities;
  lVar16 = 8;
  do {
    if (lVar16 + 0x10 == 0x38) break;
    dVar4 = *(deUint32 *)((long)&queues[0].queue + lVar16);
    *(undefined4 *)((long)ppfVar9 + -4) = 0;
    ((VkDeviceQueueCreateInfo *)(ppfVar9 + -4))->sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
    *(undefined8 *)((long)ppfVar9 + -0x1c) = 0;
    *(undefined8 *)((long)ppfVar9 + -0x14) = 0;
    *(deUint32 *)((long)ppfVar9 + -0xc) = dVar4;
    *(uint *)(ppfVar9 + -1) = (iVar3 == iVar5) + 1;
    *ppfVar9 = queuePriorities;
    ppfVar9 = ppfVar9 + 5;
    lVar16 = lVar16 + 0x10;
  } while (iVar3 != iVar5);
  deviceInfo.enabledExtensionCount = 0;
  deviceInfo._52_4_ = 0;
  deviceInfo.ppEnabledExtensionNames = (char **)0x0;
  deviceInfo.enabledLayerCount = 0;
  deviceInfo._36_4_ = 0;
  deviceInfo.ppEnabledLayerNames = (char **)0x0;
  deviceInfo.flags = 0;
  deviceInfo.queueCreateInfoCount = 0;
  deviceInfo.pQueueCreateInfos = (VkDeviceQueueCreateInfo *)0x0;
  deviceInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  deviceInfo._4_4_ = 0;
  deviceInfo.pNext = (void *)0x0;
  deviceInfo.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
  (*vk_00->_vptr_InstanceInterface[2])(vk_00,physicalDevice,&deviceFeatures);
  deviceInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  deviceInfo.pNext = (void *)0x0;
  deviceInfo._48_8_ = deviceInfo._48_8_ & 0xffffffff00000000;
  deviceInfo.ppEnabledExtensionNames = (char **)0x0;
  deviceInfo._32_8_ = deviceInfo._32_8_ & 0xffffffff00000000;
  deviceInfo.ppEnabledLayerNames = (char **)0x0;
  deviceInfo.queueCreateInfoCount = (queues[0].queueFamilyIndex != queues[1].queueFamilyIndex) + 1;
  deviceInfo.pQueueCreateInfos = queueInfos;
  deviceInfo.pEnabledFeatures = &deviceFeatures;
  ::vk::createDevice((Move<vk::VkDevice_s_*> *)&local_438,vk_00,physicalDevice,&deviceInfo,
                     (VkAllocationCallbacks *)0x0);
  swapInfo._16_8_ = local_438.m_data.deleter.m_device;
  swapInfo._0_8_ = local_438.m_data.object.m_internal;
  swapInfo.pNext = local_438.m_data.deleter.m_deviceIface;
  local_438.m_data.deleter.m_device = (VkDevice)0x0;
  local_438.m_data.object.m_internal = 0;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  if (local_418.m_data.object != (VkDevice)0x0) {
    (*local_418.m_data.deleter.m_destroyDevice)
              (local_418.m_data.object,local_418.m_data.deleter.m_allocator);
  }
  local_418.m_data.deleter.m_allocator = (VkAllocationCallbacks *)swapInfo._16_8_;
  local_418.m_data.object = (VkDevice_s *)swapInfo._0_8_;
  local_418.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)swapInfo.pNext;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase((RefBase<vk::VkDevice_s_*> *)&local_438);
  pQVar17 = queues;
  for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
    (*vk->_vptr_DeviceInterface[1])(vk,local_418.m_data.object,(ulong)pQVar17->queueFamilyIndex);
    pQVar17 = pQVar17 + 1;
  }
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&local_438,vk,local_418.m_data.object,0,
             (VkAllocationCallbacks *)0x0);
  swapInfo._16_8_ = local_438.m_data.deleter.m_device;
  swapInfo.pWaitSemaphores = (VkSemaphore *)local_438.m_data.deleter.m_allocator;
  swapInfo._0_8_ = local_438.m_data.object.m_internal;
  swapInfo.pNext = local_438.m_data.deleter.m_deviceIface;
  local_438.m_data.object.m_internal = 0;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_438.m_data.deleter.m_device = (VkDevice)0x0;
  local_438.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::reset
            (&semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>);
  semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device =
       (VkDevice)swapInfo._16_8_;
  semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)swapInfo.pWaitSemaphores;
  semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = swapInfo._0_8_;
  semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)swapInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_438);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_438,vk,local_418.m_data.object,2,
             queues[0].queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  swapInfo._16_8_ = local_438.m_data.deleter.m_device;
  swapInfo.pWaitSemaphores = (VkSemaphore *)local_438.m_data.deleter.m_allocator;
  swapInfo._0_8_ = local_438.m_data.object.m_internal;
  swapInfo.pNext = local_438.m_data.deleter.m_deviceIface;
  local_438.m_data.object.m_internal = 0;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_438.m_data.deleter.m_device = (VkDevice)0x0;
  local_438.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)swapInfo._16_8_;
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)swapInfo.pWaitSemaphores;
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       swapInfo._0_8_;
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)swapInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_438);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_438,vk,local_418.m_data.object,2,
             queues[1].queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  swapInfo._16_8_ = local_438.m_data.deleter.m_device;
  swapInfo.pWaitSemaphores = (VkSemaphore *)local_438.m_data.deleter.m_allocator;
  swapInfo._0_8_ = local_438.m_data.object.m_internal;
  swapInfo.pNext = local_438.m_data.deleter.m_deviceIface;
  local_438.m_data.object.m_internal = 0;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_438.m_data.deleter.m_device = (VkDevice)0x0;
  local_438.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)swapInfo._16_8_;
  cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)swapInfo.pWaitSemaphores;
  cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       swapInfo._0_8_;
  cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)swapInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_438);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_438,vk,local_418.m_data.object,
                    (VkCommandPool)
                    cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal);
  swapInfo._16_8_ = local_438.m_data.deleter.m_device;
  swapInfo.pWaitSemaphores = (VkSemaphore *)local_438.m_data.deleter.m_allocator;
  swapInfo._0_8_ = local_438.m_data.object.m_internal;
  swapInfo.pNext = local_438.m_data.deleter.m_deviceIface;
  local_438.m_data.object.m_internal = 0;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_438.m_data.deleter.m_device = (VkDevice)0x0;
  local_438.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            (&cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>);
  cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)swapInfo._16_8_;
  cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       (deUint64)swapInfo.pWaitSemaphores;
  cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)swapInfo._0_8_;
  cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)swapInfo.pNext;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_438);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_438,vk,local_418.m_data.object,
                    (VkCommandPool)
                    cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal);
  swapInfo._16_8_ = local_438.m_data.deleter.m_device;
  swapInfo.pWaitSemaphores = (VkSemaphore *)local_438.m_data.deleter.m_allocator;
  swapInfo._0_8_ = local_438.m_data.object.m_internal;
  swapInfo.pNext = local_438.m_data.deleter.m_deviceIface;
  local_438.m_data.object.m_internal = 0;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_438.m_data.deleter.m_device = (VkDevice)0x0;
  local_438.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this = &cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset(this);
  cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)swapInfo._16_8_;
  cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       (deUint64)swapInfo.pWaitSemaphores;
  cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)swapInfo._0_8_;
  cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)swapInfo.pNext;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_438);
  local_268[0] = 4;
  local_260 = 0;
  local_258 = 0;
  local_250 = 0;
  uStack_248 = 0;
  local_240 = 1;
  local_218 = 0;
  local_200 = stageBits;
  local_1e8 = 0;
  local_1e0 = 0;
  local_238 = &cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>;
  local_230 = local_240;
  local_228 = &semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>;
  local_220[0] = local_268[0];
  local_210 = local_240;
  local_208 = &semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>;
  local_1f8 = local_240;
  local_1f0 = this;
  VVar2 = (*vk->_vptr_DeviceInterface[0x49])
                    (vk,cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,&info);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*cmdBuffer[FIRST], &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                    ,0xe0);
  endCommandBuffer(vk,cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  VVar2 = (*vk->_vptr_DeviceInterface[0x49])
                    (vk,cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,&info);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*cmdBuffer[SECOND], &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                    ,0xe2);
  endCommandBuffer(vk,cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_438,vk,local_418.m_data.object,0,
                    (VkAllocationCallbacks *)0x0);
  swapInfo._16_8_ = local_438.m_data.deleter.m_device;
  swapInfo.pWaitSemaphores = (VkSemaphore *)local_438.m_data.deleter.m_allocator;
  swapInfo._0_8_ = local_438.m_data.object.m_internal;
  swapInfo.pNext = local_438.m_data.deleter.m_deviceIface;
  local_438.m_data.object.m_internal = 0;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_438.m_data.deleter.m_device = (VkDevice)0x0;
  local_438.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset
            (&fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)swapInfo._16_8_;
  fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)swapInfo.pWaitSemaphores;
  fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = swapInfo._0_8_;
  fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)swapInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&local_438);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_438,vk,local_418.m_data.object,0,
                    (VkAllocationCallbacks *)0x0);
  swapInfo._16_8_ = local_438.m_data.deleter.m_device;
  swapInfo.pWaitSemaphores = (VkSemaphore *)local_438.m_data.deleter.m_allocator;
  swapInfo._0_8_ = local_438.m_data.object.m_internal;
  swapInfo.pNext = local_438.m_data.deleter.m_deviceIface;
  local_438.m_data.object.m_internal = 0;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_438.m_data.deleter.m_device = (VkDevice)0x0;
  local_438.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00 = &fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset(this_00);
  fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)swapInfo._16_8_;
  fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)swapInfo.pWaitSemaphores;
  fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = swapInfo._0_8_;
  fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)swapInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&local_438);
  VVar2 = (*vk->_vptr_DeviceInterface[2])
                    (vk,queues[0].queue,1,local_268,
                     fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
                    );
  ::vk::checkResult(VVar2,
                    "vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                    ,0xe8);
  VVar2 = (*vk->_vptr_DeviceInterface[2])
                    (vk,queues[1].queue,1,local_220,
                     fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
                    );
  ::vk::checkResult(VVar2,
                    "vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                    ,0xe9);
  iVar3 = (*vk->_vptr_DeviceInterface[0x16])
                    (vk,local_418.m_data.object,1,fence,1,0xffffffffffffffff);
  if (iVar3 == 0) {
    iVar3 = (*vk->_vptr_DeviceInterface[0x16])
                      (vk,local_418.m_data.object,1,this_00,1,0xffffffffffffffff);
    if (iVar3 == 0) {
      pVVar12 = &swapInfo;
      lVar16 = 9;
      puVar10 = (undefined8 *)local_220;
      pVVar13 = pVVar12;
      for (lVar7 = lVar16; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(undefined8 *)pVVar13 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar18 * -2 + 1;
        pVVar13 = (VkSubmitInfo *)((long)pVVar13 + (ulong)bVar18 * -0x10 + 8);
      }
      puVar10 = (undefined8 *)local_268;
      puVar11 = puVar10;
      puVar14 = (undefined8 *)local_220;
      for (lVar7 = lVar16; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar14 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar18 * -2 + 1;
        puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
      }
      for (; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar10 = *(undefined8 *)pVVar12;
        pVVar12 = (VkSubmitInfo *)((long)pVVar12 + (ulong)bVar18 * -0x10 + 8);
        puVar10 = puVar10 + (ulong)bVar18 * -2 + 1;
      }
      local_238 = &cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>;
      local_1f0 = this;
      VVar2 = (*vk->_vptr_DeviceInterface[0x14])(vk,local_418.m_data.object,1,fence);
      ::vk::checkResult(VVar2,"vk.resetFences(*logicalDevice, 1u, &fence[FIRST].get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                        ,0xf9);
      VVar2 = (*vk->_vptr_DeviceInterface[0x14])(vk,local_418.m_data.object,1,this_00);
      ::vk::checkResult(VVar2,"vk.resetFences(*logicalDevice, 1u, &fence[SECOND].get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                        ,0xfa);
      VVar2 = (*vk->_vptr_DeviceInterface[2])
                        (vk,queues[1].queue,1,local_220,
                         fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                         m_internal);
      ::vk::checkResult(VVar2,
                        "vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                        ,0xfc);
      VVar2 = (*vk->_vptr_DeviceInterface[2])
                        (vk,queues[0].queue,1,local_268,
                         fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                         m_internal);
      ::vk::checkResult(VVar2,
                        "vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                        ,0xfd);
      iVar3 = (*vk->_vptr_DeviceInterface[0x16])
                        (vk,local_418.m_data.object,1,fence,1,0xffffffffffffffff);
      if (iVar3 == 0) {
        iVar3 = (*vk->_vptr_DeviceInterface[0x16])
                          (vk,local_418.m_data.object,1,this_00,1,0xffffffffffffffff);
        if (iVar3 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&swapInfo,"Basic semaphore tests with multi queue passed",
                     (allocator<char> *)&local_438);
          tcu::TestStatus::pass(__return_storage_ptr__,(string *)&swapInfo);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&swapInfo,"Basic semaphore tests with multi queue failed",
                     (allocator<char> *)&local_438);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&swapInfo);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&swapInfo,"Basic semaphore tests with multi queue failed",
                   (allocator<char> *)&local_438);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&swapInfo);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&swapInfo,"Basic semaphore tests with multi queue failed",
                 (allocator<char> *)&local_438);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&swapInfo);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&swapInfo,"Basic semaphore tests with multi queue failed",
               (allocator<char> *)&local_438);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&swapInfo);
  }
  std::__cxx11::string::~string((string *)&swapInfo);
  lVar16 = 0x20;
  do {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
               ((long)&fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                       m_internal + lVar16));
    lVar16 = lVar16 + -0x20;
  } while (lVar16 != -0x20);
  lVar16 = 0x20;
  do {
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)
               ((long)&cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar16));
    lVar16 = lVar16 + -0x20;
  } while (lVar16 != -0x20);
  lVar16 = 0x20;
  do {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
               ((long)&cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                       m_internal + lVar16));
    lVar16 = lVar16 + -0x20;
  } while (lVar16 != -0x20);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
            (&semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>);
  std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
  ~_Vector_base(&queueFamilyProperties.
                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               );
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_418);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus basicMultiQueueCase (Context& context)
{
	enum {NO_MATCH_FOUND = ~((deUint32)0)};
	enum QueuesIndexes {FIRST = 0, SECOND, COUNT};

	struct Queues
	{
		VkQueue		queue;
		deUint32	queueFamilyIndex;
	};


	const DeviceInterface&					vk							= context.getDeviceInterface();
	const InstanceInterface&				instance					= context.getInstanceInterface();
	const VkPhysicalDevice					physicalDevice				= context.getPhysicalDevice();
	vk::Move<vk::VkDevice>					logicalDevice;
	std::vector<VkQueueFamilyProperties>	queueFamilyProperties;
	VkDeviceCreateInfo						deviceInfo;
	VkPhysicalDeviceFeatures				deviceFeatures;
	const float								queuePriorities[COUNT]		= {1.0f, 1.0f};
	VkDeviceQueueCreateInfo					queueInfos[COUNT];
	Queues									queues[COUNT]				=
																		{
																			{DE_NULL, (deUint32)NO_MATCH_FOUND},
																			{DE_NULL, (deUint32)NO_MATCH_FOUND}
																		};
	const VkCommandBufferBeginInfo			info						=
																		{
																			VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
																			DE_NULL,										// const void*                              pNext;
																			VK_COMMAND_BUFFER_USAGE_SIMULTANEOUS_USE_BIT,	// VkCommandBufferUsageFlags                flags;
																			DE_NULL,										// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
																		};
	Move<VkSemaphore>						semaphore;
	Move<VkCommandPool>						cmdPool[COUNT];
	Move<VkCommandBuffer>					cmdBuffer[COUNT];
	const VkPipelineStageFlags				stageBits[]					= { VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT };
	VkSubmitInfo							submitInfo[COUNT];
	Move<VkFence>							fence[COUNT];

	queueFamilyProperties = getPhysicalDeviceQueueFamilyProperties(instance, physicalDevice);

	for (deUint32 queueNdx = 0; queueNdx < queueFamilyProperties.size(); ++queueNdx)
	{
		if (NO_MATCH_FOUND == queues[FIRST].queueFamilyIndex)
			queues[FIRST].queueFamilyIndex = queueNdx;

		if (queues[FIRST].queueFamilyIndex != queueNdx || queueFamilyProperties[queueNdx].queueCount > 1u)
		{
			queues[SECOND].queueFamilyIndex = queueNdx;
			break;
		}
	}

	if (queues[FIRST].queueFamilyIndex == NO_MATCH_FOUND || queues[SECOND].queueFamilyIndex == NO_MATCH_FOUND)
		TCU_THROW(NotSupportedError, "Queues couldn't be created");

	for (int queueNdx = 0; queueNdx < COUNT; ++queueNdx)
	{
		VkDeviceQueueCreateInfo queueInfo;
		deMemset(&queueInfo, 0, sizeof(queueInfo));

		queueInfo.sType				= VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
		queueInfo.pNext				= DE_NULL;
		queueInfo.flags				= (VkDeviceQueueCreateFlags)0u;
		queueInfo.queueFamilyIndex	= queues[queueNdx].queueFamilyIndex;
		queueInfo.queueCount		= (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex) ? 2 : 1;
		queueInfo.pQueuePriorities	= queuePriorities;

		queueInfos[queueNdx]		= queueInfo;

		if (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex)
			break;
	}

	deMemset(&deviceInfo, 0, sizeof(deviceInfo));
	instance.getPhysicalDeviceFeatures(physicalDevice, &deviceFeatures);

	deviceInfo.sType					= VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
	deviceInfo.pNext					= DE_NULL;
	deviceInfo.enabledExtensionCount	= 0u;
	deviceInfo.ppEnabledExtensionNames	= DE_NULL;
	deviceInfo.enabledLayerCount		= 0u;
	deviceInfo.ppEnabledLayerNames		= DE_NULL;
	deviceInfo.pEnabledFeatures			= &deviceFeatures;
	deviceInfo.queueCreateInfoCount		= (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex) ? 1 : COUNT;
	deviceInfo.pQueueCreateInfos		= queueInfos;

	logicalDevice = vk::createDevice(instance, physicalDevice, &deviceInfo);

	for (deUint32 queueReqNdx = 0; queueReqNdx < COUNT; ++queueReqNdx)
	{
		if (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex)
			vk.getDeviceQueue(*logicalDevice, queues[queueReqNdx].queueFamilyIndex, queueReqNdx, &queues[queueReqNdx].queue);
		else
			vk.getDeviceQueue(*logicalDevice, queues[queueReqNdx].queueFamilyIndex, 0u, &queues[queueReqNdx].queue);
	}

	semaphore			= (createSemaphore (vk, *logicalDevice));
	cmdPool[FIRST]		= (createCommandPool(vk, *logicalDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queues[FIRST].queueFamilyIndex));
	cmdPool[SECOND]		= (createCommandPool(vk, *logicalDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queues[SECOND].queueFamilyIndex));
	cmdBuffer[FIRST]	= (makeCommandBuffer(vk, *logicalDevice, *cmdPool[FIRST]));
	cmdBuffer[SECOND]	= (makeCommandBuffer(vk, *logicalDevice, *cmdPool[SECOND]));

	submitInfo[FIRST].sType					= VK_STRUCTURE_TYPE_SUBMIT_INFO;
	submitInfo[FIRST].pNext					= DE_NULL;
	submitInfo[FIRST].waitSemaphoreCount	= 0u;
	submitInfo[FIRST].pWaitSemaphores		= DE_NULL;
	submitInfo[FIRST].pWaitDstStageMask		= (const VkPipelineStageFlags*)DE_NULL;
	submitInfo[FIRST].commandBufferCount	= 1u;
	submitInfo[FIRST].pCommandBuffers		= &cmdBuffer[FIRST].get();
	submitInfo[FIRST].signalSemaphoreCount	= 1u;
	submitInfo[FIRST].pSignalSemaphores		= &semaphore.get();

	submitInfo[SECOND].sType					= VK_STRUCTURE_TYPE_SUBMIT_INFO;
	submitInfo[SECOND].pNext					= DE_NULL;
	submitInfo[SECOND].waitSemaphoreCount		= 1u;
	submitInfo[SECOND].pWaitSemaphores			= &semaphore.get();
	submitInfo[SECOND].pWaitDstStageMask		= stageBits;
	submitInfo[SECOND].commandBufferCount		= 1u;
	submitInfo[SECOND].pCommandBuffers			= &cmdBuffer[SECOND].get();
	submitInfo[SECOND].signalSemaphoreCount		= 0u;
	submitInfo[SECOND].pSignalSemaphores		= DE_NULL;

	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer[FIRST], &info));
	endCommandBuffer(vk, *cmdBuffer[FIRST]);
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer[SECOND], &info));
	endCommandBuffer(vk, *cmdBuffer[SECOND]);

	fence[FIRST]  = (createFence(vk, *logicalDevice));
	fence[SECOND] = (createFence(vk, *logicalDevice));

	VK_CHECK(vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST]));
	VK_CHECK(vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND]));

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[FIRST].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[SECOND].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	{
		VkSubmitInfo swapInfo				= submitInfo[SECOND];
		submitInfo[SECOND]					= submitInfo[FIRST];
		submitInfo[FIRST]					= swapInfo;
		submitInfo[SECOND].pCommandBuffers	= &cmdBuffer[SECOND].get();
		submitInfo[FIRST].pCommandBuffers	= &cmdBuffer[FIRST].get();
	}

	VK_CHECK(vk.resetFences(*logicalDevice, 1u, &fence[FIRST].get()));
	VK_CHECK(vk.resetFences(*logicalDevice, 1u, &fence[SECOND].get()));

	VK_CHECK(vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND]));
	VK_CHECK(vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST]));

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[FIRST].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[SECOND].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	return tcu::TestStatus::pass("Basic semaphore tests with multi queue passed");
}